

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Render(void)

{
  int iVar1;
  ImGuiWindow *window_00;
  ImGuiContext *pIVar2;
  ImTextureID pvVar3;
  bool bVar4;
  value_type *ppIVar5;
  ImVector<ImDrawList_*> *this;
  value_type *__dest;
  value_type *__src;
  ImDrawList **local_148;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImTextureID local_58;
  ImTextureID tex_id;
  ImVec2 size;
  ImVec2 pos;
  ImGuiMouseCursorData *cursor_data;
  ImVector<ImDrawList_*> *layer;
  int i_3;
  int i_2;
  int flattened_size;
  int n;
  ImGuiWindow *window;
  int i_1;
  int i;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0xa6e,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar2->FrameCountRendered = pIVar2->FrameCount;
  if (0.0 < (pIVar2->Style).Alpha) {
    (pIVar2->IO).MetricsActiveWindows = 0;
    (pIVar2->IO).MetricsRenderIndices = 0;
    (pIVar2->IO).MetricsRenderVertices = 0;
    for (window._4_4_ = 0; window._4_4_ < 3; window._4_4_ = window._4_4_ + 1) {
      ImVector<ImDrawList_*>::resize(pIVar2->RenderDrawLists + window._4_4_,0);
    }
    for (window._0_4_ = 0; (int)window != (pIVar2->Windows).Size; window._0_4_ = (int)window + 1) {
      ppIVar5 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->Windows,(int)window);
      window_00 = *ppIVar5;
      if ((((window_00->Active & 1U) != 0) && (window_00->HiddenFrames < 1)) &&
         ((window_00->Flags & 0x100000U) == 0)) {
        (pIVar2->IO).MetricsActiveWindows = (pIVar2->IO).MetricsActiveWindows + 1;
        if ((window_00->Flags & 0x2000000U) == 0) {
          if ((window_00->Flags & 0x1000000U) == 0) {
            AddWindowToRenderList(pIVar2->RenderDrawLists,window_00);
          }
          else {
            AddWindowToRenderList(pIVar2->RenderDrawLists + 2,window_00);
          }
        }
        else {
          AddWindowToRenderList(pIVar2->RenderDrawLists + 1,window_00);
        }
      }
    }
    i_2 = pIVar2->RenderDrawLists[0].Size;
    i_3 = i_2;
    for (layer._4_4_ = 1; layer._4_4_ < 3; layer._4_4_ = layer._4_4_ + 1) {
      i_3 = pIVar2->RenderDrawLists[layer._4_4_].Size + i_3;
    }
    ImVector<ImDrawList_*>::resize(pIVar2->RenderDrawLists,i_3);
    for (layer._0_4_ = 1; (int)layer < 3; layer._0_4_ = (int)layer + 1) {
      this = pIVar2->RenderDrawLists + (int)layer;
      bVar4 = ImVector<ImDrawList_*>::empty(this);
      if (!bVar4) {
        __dest = ImVector<ImDrawList_*>::operator[](pIVar2->RenderDrawLists,i_2);
        __src = ImVector<ImDrawList_*>::operator[](this,0);
        memcpy(__dest,__src,(long)this->Size << 3);
        i_2 = this->Size + i_2;
      }
    }
    if (((pIVar2->IO).MouseDrawCursor & 1U) != 0) {
      iVar1 = pIVar2->MouseCursor;
      size = ::operator-(&(pIVar2->IO).MousePos,&pIVar2->MouseCursorData[iVar1].HotOffset);
      tex_id = *(ImTextureID *)&pIVar2->MouseCursorData[iVar1].Size;
      local_58 = ((pIVar2->IO).Fonts)->TexID;
      ImDrawList::PushTextureID(&pIVar2->OverlayDrawList,&local_58);
      pvVar3 = local_58;
      ImVec2::ImVec2(&local_68,1.0,0.0);
      local_60 = ::operator+(&size,&local_68);
      ImVec2::ImVec2(&local_80,1.0,0.0);
      local_78 = ::operator+(&size,&local_80);
      local_70 = ::operator+(&local_78,(ImVec2 *)&tex_id);
      ImDrawList::AddImage
                (&pIVar2->OverlayDrawList,pvVar3,&local_60,&local_70,
                 pIVar2->MouseCursorData[iVar1].TexUvMin + 1,
                 pIVar2->MouseCursorData[iVar1].TexUvMax + 1,0x30000000);
      pvVar3 = local_58;
      ImVec2::ImVec2(&local_90,2.0,0.0);
      local_88 = ::operator+(&size,&local_90);
      ImVec2::ImVec2(&local_a8,2.0,0.0);
      local_a0 = ::operator+(&size,&local_a8);
      local_98 = ::operator+(&local_a0,(ImVec2 *)&tex_id);
      ImDrawList::AddImage
                (&pIVar2->OverlayDrawList,pvVar3,&local_88,&local_98,
                 pIVar2->MouseCursorData[iVar1].TexUvMin + 1,
                 pIVar2->MouseCursorData[iVar1].TexUvMax + 1,0x30000000);
      pvVar3 = local_58;
      local_b0 = ::operator+(&size,(ImVec2 *)&tex_id);
      ImDrawList::AddImage
                (&pIVar2->OverlayDrawList,pvVar3,&size,&local_b0,
                 pIVar2->MouseCursorData[iVar1].TexUvMin + 1,
                 pIVar2->MouseCursorData[iVar1].TexUvMax + 1,0xff000000);
      pvVar3 = local_58;
      local_b8 = ::operator+(&size,(ImVec2 *)&tex_id);
      ImDrawList::AddImage
                (&pIVar2->OverlayDrawList,pvVar3,&size,&local_b8,
                 pIVar2->MouseCursorData[iVar1].TexUvMin,pIVar2->MouseCursorData[iVar1].TexUvMax,
                 0xffffffff);
      ImDrawList::PopTextureID(&pIVar2->OverlayDrawList);
    }
    bVar4 = ImVector<ImDrawVert>::empty(&(pIVar2->OverlayDrawList).VtxBuffer);
    if (!bVar4) {
      AddDrawListToRenderList(pIVar2->RenderDrawLists,&pIVar2->OverlayDrawList);
    }
    (pIVar2->RenderDrawData).Valid = true;
    if (pIVar2->RenderDrawLists[0].Size < 1) {
      local_148 = (ImDrawList **)0x0;
    }
    else {
      local_148 = ImVector<ImDrawList_*>::operator[](pIVar2->RenderDrawLists,0);
    }
    (pIVar2->RenderDrawData).CmdLists = local_148;
    (pIVar2->RenderDrawData).CmdListsCount = pIVar2->RenderDrawLists[0].Size;
    (pIVar2->RenderDrawData).TotalVtxCount = (pIVar2->IO).MetricsRenderVertices;
    (pIVar2->RenderDrawData).TotalIdxCount = (pIVar2->IO).MetricsRenderIndices;
    if ((0 < (pIVar2->RenderDrawData).CmdListsCount) &&
       ((pIVar2->IO).RenderDrawListsFn != (_func_void_ImDrawData_ptr *)0x0)) {
      (*(pIVar2->IO).RenderDrawListsFn)(&pIVar2->RenderDrawData);
    }
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);   // Forgot to call ImGui::NewFrame()

    if (g.FrameCountEnded != g.FrameCount)
        ImGui::EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Skip render altogether if alpha is 0.0
    // Note that vertex buffers have been created and are wasted, so it is best practice that you don't create windows in the first place, or consistently respond to Begin() returning false.
    if (g.Style.Alpha > 0.0f)
    {
        // Gather windows to render
        g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsActiveWindows = 0;
        for (int i = 0; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
            g.RenderDrawLists[i].resize(0);
        for (int i = 0; i != g.Windows.Size; i++)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window->Active && window->HiddenFrames <= 0 && (window->Flags & (ImGuiWindowFlags_ChildWindow)) == 0)
            {
                // FIXME: Generalize this with a proper layering system so e.g. user can draw in specific layers, below text, ..
                g.IO.MetricsActiveWindows++;
                if (window->Flags & ImGuiWindowFlags_Popup)
                    AddWindowToRenderList(g.RenderDrawLists[1], window);
                else if (window->Flags & ImGuiWindowFlags_Tooltip)
                    AddWindowToRenderList(g.RenderDrawLists[2], window);
                else
                    AddWindowToRenderList(g.RenderDrawLists[0], window);
            }
        }

        // Flatten layers
        int n = g.RenderDrawLists[0].Size;
        int flattened_size = n;
        for (int i = 1; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
            flattened_size += g.RenderDrawLists[i].Size;
        g.RenderDrawLists[0].resize(flattened_size);
        for (int i = 1; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
        {
            ImVector<ImDrawList*>& layer = g.RenderDrawLists[i];
            if (layer.empty())
                continue;
            memcpy(&g.RenderDrawLists[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
            n += layer.Size;
        }

        // Draw software mouse cursor if requested
        if (g.IO.MouseDrawCursor)
        {
            const ImGuiMouseCursorData& cursor_data = g.MouseCursorData[g.MouseCursor];
            const ImVec2 pos = g.IO.MousePos - cursor_data.HotOffset;
            const ImVec2 size = cursor_data.Size;
            const ImTextureID tex_id = g.IO.Fonts->TexID;
            g.OverlayDrawList.PushTextureID(tex_id);
            g.OverlayDrawList.AddImage(tex_id, pos+ImVec2(1,0), pos+ImVec2(1,0) + size, cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,48));        // Shadow
            g.OverlayDrawList.AddImage(tex_id, pos+ImVec2(2,0), pos+ImVec2(2,0) + size, cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,48));        // Shadow
            g.OverlayDrawList.AddImage(tex_id, pos,             pos + size,             cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,255));       // Black border
            g.OverlayDrawList.AddImage(tex_id, pos,             pos + size,             cursor_data.TexUvMin[0], cursor_data.TexUvMax[0], IM_COL32(255,255,255,255)); // White fill
            g.OverlayDrawList.PopTextureID();
        }
        if (!g.OverlayDrawList.VtxBuffer.empty())
            AddDrawListToRenderList(g.RenderDrawLists[0], &g.OverlayDrawList);

        // Setup draw data
        g.RenderDrawData.Valid = true;
        g.RenderDrawData.CmdLists = (g.RenderDrawLists[0].Size > 0) ? &g.RenderDrawLists[0][0] : NULL;
        g.RenderDrawData.CmdListsCount = g.RenderDrawLists[0].Size;
        g.RenderDrawData.TotalVtxCount = g.IO.MetricsRenderVertices;
        g.RenderDrawData.TotalIdxCount = g.IO.MetricsRenderIndices;

        // Render. If user hasn't set a callback then they may retrieve the draw data via GetDrawData()
        if (g.RenderDrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
            g.IO.RenderDrawListsFn(&g.RenderDrawData);
    }
}